

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,Benchmark *other)

{
  BenchmarkImp *this_00;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_0014a808;
  this_00 = (BenchmarkImp *)operator_new(0x80);
  BenchmarkImp::BenchmarkImp(this_00,other->imp_);
  this->imp_ = this_00;
  return;
}

Assistant:

Benchmark::Benchmark(Benchmark const& other)
  : imp_(new BenchmarkImp(*other.imp_))
{
}